

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O3

err_t cmdFilePrefixRead(octet *prefix,size_t *count,char *name,size_t offset)

{
  bool_t bVar1;
  file_t file;
  size_t sVar2;
  octet *der;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  err_t eVar6;
  size_t len;
  u32 tag;
  size_t local_40;
  u32 local_34;
  
  file = fileOpen(name,"rb");
  if (file == (file_t)0x0) {
    return 0xcb;
  }
  sVar2 = fileSize(file);
  if (sVar2 == 0xffffffffffffffff) {
    eVar6 = 0xcf;
  }
  else {
    eVar6 = 0xd1;
    uVar5 = sVar2 - offset;
    if (offset <= sVar2 && uVar5 != 0) {
      der = (octet *)blobCreate(0x10);
      if (der != (octet *)0x0) {
        sVar4 = 0x10;
        if (uVar5 < 0x10) {
          sVar4 = uVar5;
        }
        bVar1 = fileSeek(file,offset,0);
        if ((bVar1 == 0) || (sVar3 = fileRead2(der,sVar4,file), sVar3 != sVar4)) {
LAB_00104766:
          blobClose(der);
          fileClose(file);
          return 0xcf;
        }
        sVar4 = derTLDec(&local_34,&local_40,der,sVar4);
        if ((sVar4 == 0xffffffffffffffff) || (sVar2 < sVar4 + offset + local_40)) {
          blobClose(der);
          fileClose(file);
        }
        else {
          sVar4 = local_40 + sVar4;
          blobClose(der);
          der = (octet *)blobCreate(sVar4);
          if (der == (octet *)0x0) goto LAB_00104808;
          bVar1 = fileSeek(file,offset,0);
          if ((bVar1 == 0) || (sVar2 = fileRead2(der,sVar4,file), sVar2 != sVar4))
          goto LAB_00104766;
          bVar1 = fileClose(file);
          if (bVar1 == 0) {
            blobClose(der);
            return 0x67;
          }
          bVar1 = derIsValid3(der,sVar4);
          if (bVar1 != 0) {
            eVar6 = 0;
            if ((prefix != (octet *)0x0) && (eVar6 = 0x6e, sVar4 <= *count)) {
              memCopy(prefix,der,sVar4);
              eVar6 = 0;
            }
            *count = sVar4;
            blobClose(der);
            return eVar6;
          }
          blobClose(der);
        }
        return 0x132;
      }
LAB_00104808:
      fileClose(file);
      return 0x6e;
    }
  }
  fileClose(file);
  return eVar6;
}

Assistant:

err_t cmdFilePrefixRead(octet* prefix, size_t* count, const char* name,
	size_t offset)
{
	const size_t buf_size = 16;
	err_t code;
	file_t file;
	size_t size;
	void* buf;
	size_t c;
	u32 tag;
	size_t len;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(count, O_PER_S));
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (offset >= size)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// прочитать заголовок префикса
	c = MIN2(buf_size, size - offset);
	if (!fileSeek(file, offset, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// определить длину префикса
	c = derTLDec(&tag, &len, buf, c);
	if (c == SIZE_MAX || offset + c + len > size)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	c += len;
	// прочитать префикс
	cmdBlobClose(buf);
	code = cmdBlobCreate(buf, c);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	if (!fileSeek(file, offset, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить префикс
	if (!derIsValid3(buf, c))
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// возвратить префикс и его длину
	if (prefix)
	{
		ASSERT(memIsValid(prefix, *count));
		if (*count < c)
			code = ERR_OUTOFMEMORY;
		else
			memCopy(prefix, buf, c);
	}
	*count = c;
	// завершить
	cmdBlobClose(buf);
	return code;
}